

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i2c.c
# Opt level: O0

void envy_bios_print_i2c(envy_bios *bios,FILE *out,uint mask)

{
  uint uVar1;
  envy_bios_i2c *peVar2;
  envy_bios_i2c_entry *peVar3;
  char *pcVar4;
  char *typename;
  envy_bios_i2c_entry *entry;
  int i;
  envy_bios_i2c *i2c;
  uint mask_local;
  FILE *out_local;
  envy_bios *bios_local;
  
  peVar2 = &bios->i2c;
  if ((peVar2->offset != 0) && ((mask & 0x40000) != 0)) {
    if ((bios->i2c).valid == '\0') {
      fprintf((FILE *)out,"Failed to parse I2C table at 0x%04x version %d.%d\n\n",
              (ulong)peVar2->offset,(ulong)(uint)((int)(uint)(bios->i2c).version >> 4),
              (ulong)((bios->i2c).version & 0xf));
    }
    else {
      fprintf((FILE *)out,"I2C table at 0x%04x version %d.%d",(ulong)peVar2->offset,
              (ulong)(uint)((int)(uint)(bios->i2c).version >> 4),(ulong)((bios->i2c).version & 0xf))
      ;
      fprintf((FILE *)out," defaults %d %d",(ulong)(bios->i2c).def[0],(ulong)(bios->i2c).def[1]);
      fprintf((FILE *)out,"\n");
      envy_bios_dump_hex(bios,out,(uint)peVar2->offset,(uint)(bios->i2c).hlen,mask);
      for (entry._4_4_ = 0; (int)entry._4_4_ < (int)(uint)(bios->i2c).entriesnum;
          entry._4_4_ = entry._4_4_ + 1) {
        peVar3 = (bios->i2c).entries + (int)entry._4_4_;
        if ((peVar3->type != 0xff) || ((mask & 0x40000000) != 0)) {
          pcVar4 = find_enum(i2c_types,(uint)peVar3->type);
          fprintf((FILE *)out,"I2C %d:",(ulong)entry._4_4_);
          fprintf((FILE *)out," type 0x%02x [%s]",(ulong)peVar3->type,pcVar4);
          uVar1 = (uint)peVar3->type;
          if (uVar1 == 0) {
            fprintf((FILE *)out," wr 0x%02x",(ulong)peVar3->vgacr_wr);
            fprintf((FILE *)out," rd 0x%02x",(ulong)peVar3->vgacr_rd);
            if (peVar3->unk02 != '\0') {
              fprintf((FILE *)out," unk02 0x%02x",(ulong)peVar3->unk02);
            }
          }
          else if (uVar1 == 4) {
            fprintf((FILE *)out," loc %d",(ulong)peVar3->loc);
            if (peVar3->unk00_4 != '\0') {
              fprintf((FILE *)out," unk00_4 %d",(ulong)peVar3->unk00_4);
            }
            fprintf((FILE *)out," addr 0x%02x",(ulong)peVar3->addr);
            if (peVar3->unk02 != '\0') {
              fprintf((FILE *)out," unk02 0x%02x",(ulong)peVar3->unk02);
            }
          }
          else if (uVar1 - 5 < 2) {
            fprintf((FILE *)out," loc %d",(ulong)peVar3->loc);
            if (peVar3->unk00_4 != '\0') {
              fprintf((FILE *)out," unk00_4 %d",(ulong)peVar3->unk00_4);
            }
            if (peVar3->shared == '\0') {
              if (peVar3->sharedid != '\0') {
                fprintf((FILE *)out," unk01_1 %d",(ulong)peVar3->sharedid);
              }
            }
            else {
              fprintf((FILE *)out," shared %d",(ulong)peVar3->sharedid);
            }
            if (peVar3->unk01_5 != '\0') {
              fprintf((FILE *)out," unk01_5 %d",(ulong)peVar3->unk01_5);
            }
            if (peVar3->unk02 != '\0') {
              fprintf((FILE *)out," unk02 0x%02x",(ulong)peVar3->unk02);
            }
          }
          fprintf((FILE *)out,"\n");
        }
        envy_bios_dump_hex(bios,out,(uint)peVar3->offset,(uint)(bios->i2c).rlen,mask);
      }
      fprintf((FILE *)out,"\n");
    }
  }
  return;
}

Assistant:

void envy_bios_print_i2c (struct envy_bios *bios, FILE *out, unsigned mask) {
	struct envy_bios_i2c *i2c = &bios->i2c;
	if (!i2c->offset || !(mask & ENVY_BIOS_PRINT_I2C))
		return;
	if (!i2c->valid) {
		fprintf(out, "Failed to parse I2C table at 0x%04x version %d.%d\n\n", i2c->offset, i2c->version >> 4, i2c->version & 0xf);
		return;
	}
	fprintf(out, "I2C table at 0x%04x version %d.%d", i2c->offset, i2c->version >> 4, i2c->version & 0xf);
	fprintf(out, " defaults %d %d", i2c->def[0], i2c->def[1]);
	fprintf(out, "\n");
	envy_bios_dump_hex(bios, out, i2c->offset, i2c->hlen, mask);
	int i;
	for (i = 0; i < i2c->entriesnum; i++) {
		struct envy_bios_i2c_entry *entry = &i2c->entries[i];
		if (entry->type != ENVY_BIOS_I2C_UNUSED || mask & ENVY_BIOS_PRINT_UNUSED) {
			const char *typename = find_enum(i2c_types, entry->type);
			fprintf(out, "I2C %d:", i);
			fprintf(out, " type 0x%02x [%s]", entry->type, typename);
			switch (entry->type) {
				case ENVY_BIOS_I2C_VGACR:
					fprintf(out, " wr 0x%02x", entry->vgacr_wr);
					fprintf(out, " rd 0x%02x", entry->vgacr_rd);
					if (entry->unk02)
						fprintf(out, " unk02 0x%02x", entry->unk02);
					break;
				case ENVY_BIOS_I2C_PCRTC:
					fprintf(out, " loc %d", entry->loc);
					if (entry->unk00_4)
						fprintf(out, " unk00_4 %d", entry->unk00_4);
					fprintf(out, " addr 0x%02x", entry->addr);
					if (entry->unk02)
						fprintf(out, " unk02 0x%02x", entry->unk02);
					break;
				case ENVY_BIOS_I2C_PNVIO:
				case ENVY_BIOS_I2C_AUXCH:
					fprintf(out, " loc %d", entry->loc);
					if (entry->unk00_4)
						fprintf(out, " unk00_4 %d", entry->unk00_4);
					if (entry->shared)
						fprintf(out, " shared %d", entry->sharedid);
					else if (entry->sharedid)
						fprintf(out, " unk01_1 %d", entry->sharedid);
					if (entry->unk01_5)
						fprintf(out, " unk01_5 %d", entry->unk01_5);
					if (entry->unk02)
						fprintf(out, " unk02 0x%02x", entry->unk02);
					break;
			}
			fprintf(out, "\n");
		}
		envy_bios_dump_hex(bios, out, entry->offset, i2c->rlen, mask);
	}
	fprintf(out, "\n");
}